

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

value_type pugi::impl::anon_unknown_0::utf8_writer::low(value_type result,uint32_t ch)

{
  byte bVar1;
  uint32_t ch_local;
  value_type result_local;
  
  bVar1 = (byte)ch;
  if (ch < 0x80) {
    *result = bVar1;
    result_local = result + 1;
  }
  else if (ch < 0x800) {
    *result = (byte)(ch >> 6) | 0xc0;
    result[1] = bVar1 & 0x3f | 0x80;
    result_local = result + 2;
  }
  else {
    *result = (byte)(ch >> 0xc) | 0xe0;
    result[1] = (byte)(ch >> 6) & 0x3f | 0x80;
    result[2] = bVar1 & 0x3f | 0x80;
    result_local = result + 3;
  }
  return result_local;
}

Assistant:

static value_type low(value_type result, uint32_t ch)
		{
			// U+0000..U+007F
			if (ch < 0x80)
			{
				*result = static_cast<uint8_t>(ch);
				return result + 1;
			}
			// U+0080..U+07FF
			else if (ch < 0x800)
			{
				result[0] = static_cast<uint8_t>(0xC0 | (ch >> 6));
				result[1] = static_cast<uint8_t>(0x80 | (ch & 0x3F));
				return result + 2;
			}
			// U+0800..U+FFFF
			else
			{
				result[0] = static_cast<uint8_t>(0xE0 | (ch >> 12));
				result[1] = static_cast<uint8_t>(0x80 | ((ch >> 6) & 0x3F));
				result[2] = static_cast<uint8_t>(0x80 | (ch & 0x3F));
				return result + 3;
			}
		}